

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_pointcloud.cc
# Opt level: O2

void anon_unknown.dwarf_63bc::printHelp(char *prgname)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,prgname);
  poVar1 = std::operator<<(poVar1,
                           " -h | [-o <output-filename>] [<interface-id>:]<device-id> [@<file>] [<key>=<value>] ..."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Gets the first synchronized image set of the Roboception rc_visard, consisting of left, disparity, confidence and error image, creates a point cloud and stores it in ply ascii format."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"Options:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"-h        Prints help information and exits");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-o <file> Set name of output file (default is \'rc_visard_<timestamp>.ply\')"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"Parameters:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "<interface-id> Optional GenICam ID of interface for connecting to the device"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "<device-id>    GenICam device ID, serial number or user defined name of device"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "@<file>        Optional file with parameters as store with parameter \'gc_info -p ...\'"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "<key>=<value>  Optional GenICam parameters to be changed in the given order"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printHelp(const char *prgname)
{
  // show help

  std::cout << prgname << " -h | [-o <output-filename>] [<interface-id>:]<device-id> [@<file>] [<key>=<value>] ..." << std::endl;
  std::cout << std::endl;
  std::cout << "Gets the first synchronized image set of the Roboception rc_visard, consisting of left, disparity, confidence and error image, creates a point cloud and stores it in ply ascii format." << std::endl;
  std::cout << std::endl;
  std::cout << "Options:" << std::endl;
  std::cout << "-h        Prints help information and exits" << std::endl;
  std::cout << "-o <file> Set name of output file (default is 'rc_visard_<timestamp>.ply')" << std::endl;
  std::cout << std::endl;
  std::cout << "Parameters:" << std::endl;
  std::cout << "<interface-id> Optional GenICam ID of interface for connecting to the device" << std::endl;
  std::cout << "<device-id>    GenICam device ID, serial number or user defined name of device" << std::endl;
  std::cout << "@<file>        Optional file with parameters as store with parameter 'gc_info -p ...'" << std::endl;
  std::cout << "<key>=<value>  Optional GenICam parameters to be changed in the given order" << std::endl;
}